

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

int __thiscall Fl_Menu_::clear_submenu(Fl_Menu_ *this,int index)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = -1;
  if (-1 < index) {
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = Fl_Menu_Item::size(this->menu_);
    }
    if ((index < iVar1) && ((this->menu_[(uint)index].flags & 0x40) != 0)) {
      uVar2 = index + 1;
      iVar3 = 0;
      while( true ) {
        iVar1 = 0;
        if (this->menu_ != (Fl_Menu_Item *)0x0) {
          iVar1 = Fl_Menu_Item::size(this->menu_);
        }
        if ((iVar1 <= (int)uVar2) || (this->menu_[uVar2].text == (char *)0x0)) break;
        remove(this,(char *)(ulong)uVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

int Fl_Menu_::clear_submenu(int index) {
  if ( index < 0 || index >= size() ) return(-1);
  if ( ! (menu_[index].flags & FL_SUBMENU) ) return(-1);
  ++index;					// advance to first item in submenu
  while ( index < size() ) {                    // keep remove()ing top item until end is reached
    if ( menu_[index].text == 0 ) break;	// end of this submenu? done
    remove(index);				// remove items/submenus
  }
  return(0);
}